

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_comm.c
# Opt level: O2

void do_split(CHAR_DATA *ch,char *argument)

{
  CHAR_DATA *pCVar1;
  ulong uVar2;
  bool bVar3;
  uint uVar4;
  char *txt;
  CHAR_DATA **ppCVar5;
  uint uVar6;
  char arg1 [4608];
  char buf [4608];
  
  one_argument(argument,arg1);
  if (arg1[0] == '\0') {
    txt = "Split how much?\n\r";
  }
  else {
    uVar4 = atoi(arg1);
    if ((int)uVar4 < 0) {
      txt = "Your group wouldn\'t like that.\n\r";
    }
    else if (uVar4 == 0) {
      txt = "You hand out zero coins, but no one notices.\n\r";
    }
    else if (ch->gold < (long)(ulong)uVar4) {
      txt = "You don\'t have that much to split.\n\r";
    }
    else {
      uVar6 = 0;
      ppCVar5 = &ch->in_room->people;
      while (pCVar1 = *ppCVar5, pCVar1 != (CHAR_DATA *)0x0) {
        bVar3 = is_same_group(pCVar1,ch);
        if (bVar3) {
          bVar3 = is_affected_by(pCVar1,0x12);
          uVar6 = uVar6 + !bVar3;
        }
        ppCVar5 = &pCVar1->next_in_room;
      }
      if ((int)uVar6 < 2) {
        txt = "Just keep it all.\n\r";
      }
      else {
        if (uVar6 <= uVar4) {
          uVar2 = (ulong)uVar4 / (ulong)uVar6;
          ch->gold = (ch->gold - (ulong)uVar4) + (ulong)(uVar4 % uVar6 + (int)uVar2);
          sprintf(buf,"You split %d gold coins. Your share is %d gold.\n\r",(ulong)uVar4);
          send_to_char(buf,ch);
          sprintf(buf,"$n splits %d gold coins. Your share is %d gold.",(ulong)uVar4,uVar2);
          ppCVar5 = &ch->in_room->people;
          while (pCVar1 = *ppCVar5, pCVar1 != (CHAR_DATA *)0x0) {
            if (((pCVar1 != ch) && (bVar3 = is_same_group(pCVar1,ch), bVar3)) &&
               (bVar3 = is_affected_by(pCVar1,0x12), !bVar3)) {
              act(buf,ch,(void *)0x0,pCVar1,2);
              pCVar1->gold = pCVar1->gold + uVar2;
            }
            ppCVar5 = &pCVar1->next_in_room;
          }
          return;
        }
        txt = "Don\'t even bother, cheapskate.\n\r";
      }
    }
  }
  send_to_char(txt,ch);
  return;
}

Assistant:

void do_split(CHAR_DATA *ch, char *argument)
{
	char arg1[MAX_INPUT_LENGTH];
	one_argument(argument, arg1);

	if (arg1[0] == '\0')
	{
		send_to_char("Split how much?\n\r", ch);
		return;
	}

	auto amount_gold = atoi(arg1);
	if (amount_gold < 0)
	{
		send_to_char("Your group wouldn't like that.\n\r", ch);
		return;
	}

	if (amount_gold == 0)
	{
		send_to_char("You hand out zero coins, but no one notices.\n\r", ch);
		return;
	}

	if (ch->gold < amount_gold)
	{
		send_to_char("You don't have that much to split.\n\r", ch);
		return;
	}

	auto members = 0;
	for (auto gch = ch->in_room->people; gch != nullptr; gch = gch->next_in_room)
	{
		if (is_same_group(gch, ch) && !is_affected_by(gch, AFF_CHARM))
			members++;
	}

	if (members < 2)
	{
		send_to_char("Just keep it all.\n\r", ch);
		return;
	}

	auto share_gold = amount_gold / members;
	auto extra_gold = amount_gold % members;

	if (share_gold == 0)
	{
		send_to_char("Don't even bother, cheapskate.\n\r", ch);
		return;
	}

	ch->gold -= amount_gold;
	ch->gold += share_gold + extra_gold;

	char buf[MAX_STRING_LENGTH];
	if (share_gold > 0)
	{
		sprintf(buf, "You split %d gold coins. Your share is %d gold.\n\r", amount_gold, share_gold + extra_gold);
		send_to_char(buf, ch);
	}

	sprintf(buf, "$n splits %d gold coins. Your share is %d gold.", amount_gold, share_gold);

	for (auto gch = ch->in_room->people; gch != nullptr; gch = gch->next_in_room)
	{
		if (gch != ch && is_same_group(gch, ch) && !is_affected_by(gch, AFF_CHARM))
		{
			act(buf, ch, nullptr, gch, TO_VICT);
			gch->gold += share_gold;
		}
	}
}